

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_msb.hpp
# Opt level: O0

void ans_msb_decompress(uint32_t *dst,size_t to_decode,uint8_t *cSrc,size_t cSrcSize)

{
  uint32_t uVar1;
  reference pvVar2;
  ans_msb_decode *this;
  long in_RCX;
  uint8_t *in_RDX;
  ans_msb_decode *in_RSI;
  long in_RDI;
  size_t fast_decode;
  uint32_t *out_u32;
  size_t cur_idx;
  uint32_t i;
  array<unsigned_long,_4UL> states;
  ans_msb_decode ans_frame;
  uint8_t *in_u8;
  uint32_t num_states;
  size_type in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  uint32_t in_stack_ffffffffffffff14;
  uint32_t in_stack_ffffffffffffff20;
  uint32_t in_stack_ffffffffffffff24;
  uint64_t *in_stack_ffffffffffffff28;
  ans_msb_decode *local_c0;
  uint local_a4;
  uint8_t *in_stack_ffffffffffffff98;
  uint8_t *local_30;
  undefined4 local_24;
  long local_20;
  ans_msb_decode *local_10;
  long local_8;
  
  local_24 = 4;
  local_30 = in_RDX;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  ans_msb_decode::load(in_stack_ffffffffffffff98);
  local_30 = local_30 + local_20;
  for (local_a4 = 0; local_a4 < 4; local_a4 = local_a4 + 1) {
    in_stack_ffffffffffffff28 =
         (uint64_t *)
         ans_msb_decode::init_state((ans_msb_decode *)&stack0xffffffffffffff80,&local_30);
    pvVar2 = std::array<unsigned_long,_4UL>::operator[]
                       ((array<unsigned_long,_4UL> *)
                        CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        in_stack_ffffffffffffff08);
    *pvVar2 = (value_type_conflict2)in_stack_ffffffffffffff28;
  }
  this = (ans_msb_decode *)((long)local_10 - ((ulong)local_10 & 3));
  for (local_c0 = (ans_msb_decode *)0x0; local_c0 != this;
      local_c0 = (ans_msb_decode *)
                 ((long)&(local_c0->nfreqs).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start + 4)) {
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff24 =
         ans_msb_decode::decode_sym
                   (this,in_stack_ffffffffffffff28,
                    (uint8_t **)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    *(uint32_t *)(local_8 + (long)local_c0 * 4) = in_stack_ffffffffffffff24;
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff20 =
         ans_msb_decode::decode_sym
                   (this,in_stack_ffffffffffffff28,
                    (uint8_t **)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    *(uint32_t *)(local_8 + 4 + (long)local_c0 * 4) = in_stack_ffffffffffffff20;
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
    uVar1 = ans_msb_decode::decode_sym
                      (this,in_stack_ffffffffffffff28,
                       (uint8_t **)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    *(uint32_t *)(local_8 + 8 + (long)local_c0 * 4) = uVar1;
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
    uVar1 = ans_msb_decode::decode_sym
                      (this,in_stack_ffffffffffffff28,
                       (uint8_t **)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    *(uint32_t *)(local_8 + 0xc + (long)local_c0 * 4) = uVar1;
  }
  for (; local_c0 != local_10;
      local_c0 = (ans_msb_decode *)
                 ((long)&(local_c0->nfreqs).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start + 1)) {
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff14 =
         ans_msb_decode::decode_sym
                   (this,in_stack_ffffffffffffff28,
                    (uint8_t **)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    *(uint32_t *)(local_8 + (long)local_c0 * 4) = in_stack_ffffffffffffff14;
  }
  ans_msb_decode::~ans_msb_decode
            ((ans_msb_decode *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  return;
}

Assistant:

void ans_msb_decompress(
    uint32_t* dst, size_t to_decode, const uint8_t* cSrc, size_t cSrcSize)
{
    const uint32_t num_states = 4;
    auto in_u8 = reinterpret_cast<const uint8_t*>(cSrc);
    auto ans_frame = ans_msb_decode::load(in_u8);
    in_u8 += cSrcSize;

    std::array<uint64_t, num_states> states;

    for (uint32_t i = 0; i < num_states; i++) {
        states[i] = ans_frame.init_state(in_u8);
    }

    size_t cur_idx = 0;
    auto out_u32 = reinterpret_cast<uint32_t*>(dst);
    size_t fast_decode = to_decode - (to_decode % num_states);
    while (cur_idx != fast_decode) {
        out_u32[cur_idx] = ans_frame.decode_sym(states[0], in_u8);
        out_u32[cur_idx + 1] = ans_frame.decode_sym(states[1], in_u8);
        out_u32[cur_idx + 2] = ans_frame.decode_sym(states[2], in_u8);
        out_u32[cur_idx + 3] = ans_frame.decode_sym(states[3], in_u8);
        cur_idx += num_states;
    }
    while (cur_idx != to_decode) {
        out_u32[cur_idx++]
            = ans_frame.decode_sym(states[num_states - 1], in_u8);
    }
}